

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastShiftRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                        Vec_Int_t *vRes)

{
  int iLit0;
  int *pShift_00;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0x1f;
  if (nNum - 1U != 0) {
    for (; nNum - 1U >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) + 0x21;
  if ((uint)nNum < 2) {
    uVar2 = nNum;
  }
  pShift_00 = (int *)malloc((long)nShift * 4);
  memcpy(pShift_00,pShift,(long)nShift * 4);
  if (nShift < 0x1f || nShift <= (int)uVar2) {
    Wlc_BlastShiftRightInt(pNew,pNum,nNum,pShift_00,nShift,fSticky,vRes);
    if (pShift_00 == (int *)0x0) {
      return;
    }
  }
  else {
    uVar1 = (ulong)uVar2;
    iLit0 = pShift_00[uVar1];
    if (uVar2 + 1 < (uint)nShift) {
      uVar3 = uVar1 + 1;
      do {
        iLit0 = Gia_ManHashOr(pNew,iLit0,pShift_00[uVar3]);
        uVar3 = uVar3 + 1;
      } while ((uint)nShift != uVar3);
    }
    pShift_00[uVar1] = iLit0;
    Wlc_BlastShiftRightInt(pNew,pNum,nNum,pShift_00,uVar2 + 1,fSticky,vRes);
  }
  free(pShift_00);
  return;
}

Assistant:

void Wlc_BlastShiftRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    int * pShiftNew = ABC_ALLOC( int, nShift );
    memcpy( pShiftNew, pShift, sizeof(int)*nShift );
    if ( nShiftMax < nShift && nShift > 30 )
    {
        int i, iRes = pShiftNew[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShiftNew[i] );
        pShiftNew[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftRightInt( pNew, pNum, nNum, pShiftNew, nShiftMax, fSticky, vRes );
    ABC_FREE( pShiftNew );
}